

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

KNearestNeighborsClassifier * __thiscall
CoreML::Specification::Model::mutable_knearestneighborsclassifier(Model *this)

{
  KNearestNeighborsClassifier *this_00;
  
  if (this->_oneof_case_[0] == 0x194) {
    this_00 = (KNearestNeighborsClassifier *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 0x194;
    this_00 = (KNearestNeighborsClassifier *)operator_new(0x48);
    KNearestNeighborsClassifier::KNearestNeighborsClassifier(this_00);
    (this->Type_).knearestneighborsclassifier_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::KNearestNeighborsClassifier* Model::mutable_knearestneighborsclassifier() {
  if (!has_knearestneighborsclassifier()) {
    clear_Type();
    set_has_knearestneighborsclassifier();
    Type_.knearestneighborsclassifier_ = new ::CoreML::Specification::KNearestNeighborsClassifier;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.kNearestNeighborsClassifier)
  return Type_.knearestneighborsclassifier_;
}